

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O2

string * format_tm_abi_cxx11_(string *__return_storage_ptr__,tm *time,char *spec,locale *loc)

{
  long lVar1;
  long lVar2;
  time_put *ptVar3;
  size_t sVar4;
  locale local_1b0 [8];
  ostringstream os;
  long alStack_c0 [18];
  
  ptVar3 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (loc);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::ios::imbue(local_1b0);
  std::locale::~locale(local_1b0);
  lVar1 = *(long *)(_os + -0x18);
  lVar2 = *(long *)((long)alStack_c0 + lVar1);
  sVar4 = strlen(spec);
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar3,lVar2,lVar2 == 0,&os + lVar1,0x20,time,spec,spec + sVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string format_tm(const std::tm &time, const char *spec,
                      const std::locale &loc) {
  auto &facet = std::use_facet<std::time_put<char>>(loc);
  std::ostringstream os;
  os.imbue(loc);
  facet.put(os, os, ' ', &time, spec, spec + std::strlen(spec));
  return os.str();
}